

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall Assimp::ASE::Parser::ParseLV4MeshFace(Parser *this,Face *out)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  uint local_20;
  uint local_1c;
  uint iIndex;
  uint i;
  Face *out_local;
  Parser *this_local;
  
  bVar2 = SkipSpaces<char>(&this->filePtr);
  if (bVar2) {
    uVar3 = strtoul10(this->filePtr,&this->filePtr);
    out->iFace = uVar3;
    bVar2 = SkipSpaces<char>(&this->filePtr);
    if (bVar2) {
      if (*this->filePtr == ':') {
        this->filePtr = this->filePtr + 1;
      }
      for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
        local_20 = 0;
        bVar2 = SkipSpaces<char>(&this->filePtr);
        if (!bVar2) {
          LogWarning(this,"Unable to parse *MESH_FACE Element: Unexpected EOL");
          SkipToNextToken(this);
          return;
        }
        cVar1 = *this->filePtr;
        if (cVar1 != 'A') {
          if (cVar1 == 'B') {
LAB_0063183e:
            local_20 = 1;
          }
          else {
            if (cVar1 != 'C') {
              if (cVar1 == 'a') goto LAB_0063186e;
              if (cVar1 == 'b') goto LAB_0063183e;
              if (cVar1 != 'c') {
                LogWarning(this,
                           "Unable to parse *MESH_FACE Element: Unexpected EOL. A,B or C expected [#3]"
                          );
                SkipToNextToken(this);
                return;
              }
            }
            local_20 = 2;
          }
        }
LAB_0063186e:
        this->filePtr = this->filePtr + 1;
        bVar2 = SkipSpaces<char>(&this->filePtr);
        if ((!bVar2) || (*this->filePtr != ':')) {
          LogWarning(this,"Unable to parse *MESH_FACE Element: Unexpected EOL. \':\' expected [#2]")
          ;
          SkipToNextToken(this);
          return;
        }
        this->filePtr = this->filePtr + 1;
        bVar2 = SkipSpaces<char>(&this->filePtr);
        if (!bVar2) {
          LogWarning(this,
                     "Unable to parse *MESH_FACE Element: Unexpected EOL. Vertex index ecpected [#4]"
                    );
          SkipToNextToken(this);
          return;
        }
        uVar3 = strtoul10(this->filePtr,&this->filePtr);
        (out->super_FaceWithSmoothingGroup).mIndices[local_20] = uVar3;
      }
      while (*this->filePtr != '*') {
        bVar2 = IsLineEnd<char>(*this->filePtr);
        if (bVar2) {
          return;
        }
        this->filePtr = this->filePtr + 1;
      }
      bVar2 = TokenMatch<char_const>(&this->filePtr,"*MESH_SMOOTHING",0xf);
      if (bVar2) {
        bVar2 = SkipSpaces<char>(&this->filePtr);
        if (!bVar2) {
          LogWarning(this,
                     "Unable to parse *MESH_SMOOTHING Element: Unexpected EOL. Smoothing group(s) expected [#5]"
                    );
          SkipToNextToken(this);
          return;
        }
        while( true ) {
          if ((*this->filePtr < '9') && ('/' < *this->filePtr)) {
            uVar3 = strtoul10(this->filePtr,&this->filePtr);
            (out->super_FaceWithSmoothingGroup).iSmoothGroup =
                 1 << ((byte)uVar3 & 0x1f) | (out->super_FaceWithSmoothingGroup).iSmoothGroup;
          }
          SkipSpaces<char>(&this->filePtr);
          if (*this->filePtr != ',') break;
          this->filePtr = this->filePtr + 1;
          SkipSpaces<char>(&this->filePtr);
        }
      }
      while (*this->filePtr != '*') {
        bVar2 = IsLineEnd<char>(*this->filePtr);
        if (bVar2) {
          return;
        }
        this->filePtr = this->filePtr + 1;
      }
      bVar2 = TokenMatch<char_const>(&this->filePtr,"*MESH_MTLID",0xb);
      if (bVar2) {
        bVar2 = SkipSpaces<char>(&this->filePtr);
        if (bVar2) {
          uVar3 = strtoul10(this->filePtr,&this->filePtr);
          out->iMaterial = uVar3;
        }
        else {
          LogWarning(this,
                     "Unable to parse *MESH_MTLID Element: Unexpected EOL. Material index expected [#6]"
                    );
          SkipToNextToken(this);
        }
      }
    }
    else {
      LogWarning(this,"Unable to parse *MESH_FACE Element: Unexpected EOL. \':\' expected [#2]");
      SkipToNextToken(this);
    }
  }
  else {
    LogWarning(this,"Unable to parse *MESH_FACE Element: Unexpected EOL [#1]");
    SkipToNextToken(this);
  }
  return;
}

Assistant:

void Parser::ParseLV4MeshFace(ASE::Face& out)
{
    // skip spaces and tabs
    if(!SkipSpaces(&filePtr))
    {
        LogWarning("Unable to parse *MESH_FACE Element: Unexpected EOL [#1]");
        SkipToNextToken();
        return;
    }

    // parse the face index
    out.iFace = strtoul10(filePtr,&filePtr);

    // next character should be ':'
    if(!SkipSpaces(&filePtr))
    {
        // FIX: there are some ASE files which haven't got : here ....
        LogWarning("Unable to parse *MESH_FACE Element: Unexpected EOL. \':\' expected [#2]");
        SkipToNextToken();
        return;
    }
    // FIX: There are some ASE files which haven't got ':' here
    if(':' == *filePtr)++filePtr;

    // Parse all mesh indices
    for (unsigned int i = 0; i < 3;++i)
    {
        unsigned int iIndex = 0;
        if(!SkipSpaces(&filePtr))
        {
            LogWarning("Unable to parse *MESH_FACE Element: Unexpected EOL");
            SkipToNextToken();
            return;
        }
        switch (*filePtr)
        {
        case 'A':
        case 'a':
            break;
        case 'B':
        case 'b':
            iIndex = 1;
            break;
        case 'C':
        case 'c':
            iIndex = 2;
            break;
        default:
            LogWarning("Unable to parse *MESH_FACE Element: Unexpected EOL. "
                "A,B or C expected [#3]");
            SkipToNextToken();
            return;
        };
        ++filePtr;

        // next character should be ':'
        if(!SkipSpaces(&filePtr) || ':' != *filePtr)
        {
            LogWarning("Unable to parse *MESH_FACE Element: "
                "Unexpected EOL. \':\' expected [#2]");
            SkipToNextToken();
            return;
        }

        ++filePtr;
        if(!SkipSpaces(&filePtr))
        {
            LogWarning("Unable to parse *MESH_FACE Element: Unexpected EOL. "
                "Vertex index ecpected [#4]");
            SkipToNextToken();
            return;
        }
        out.mIndices[iIndex] = strtoul10(filePtr,&filePtr);
    }

    // now we need to skip the AB, BC, CA blocks.
    while (true)
    {
        if ('*' == *filePtr)break;
        if (IsLineEnd(*filePtr))
        {
            //iLineNumber++;
            return;
        }
        filePtr++;
    }

    // parse the smoothing group of the face
    if (TokenMatch(filePtr,"*MESH_SMOOTHING",15))
    {
        if(!SkipSpaces(&filePtr))
        {
            LogWarning("Unable to parse *MESH_SMOOTHING Element: "
                "Unexpected EOL. Smoothing group(s) expected [#5]");
            SkipToNextToken();
            return;
        }

        // Parse smoothing groups until we don't anymore see commas
        // FIX: There needn't always be a value, sad but true
        while (true)
        {
            if (*filePtr < '9' && *filePtr >= '0')
            {
                out.iSmoothGroup |= (1 << strtoul10(filePtr,&filePtr));
            }
            SkipSpaces(&filePtr);
            if (',' != *filePtr)
            {
                break;
            }
            ++filePtr;
            SkipSpaces(&filePtr);
        }
    }

    // *MESH_MTLID  is optional, too
    while (true)
    {
        if ('*' == *filePtr)break;
        if (IsLineEnd(*filePtr))
        {
            return;
        }
        filePtr++;
    }

    if (TokenMatch(filePtr,"*MESH_MTLID",11))
    {
        if(!SkipSpaces(&filePtr))
        {
            LogWarning("Unable to parse *MESH_MTLID Element: Unexpected EOL. "
                "Material index expected [#6]");
            SkipToNextToken();
            return;
        }
        out.iMaterial = strtoul10(filePtr,&filePtr);
    }
    return;
}